

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

void __thiscall flatbuffers::rust::RustGenerator::GenEnum(RustGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  const_iterator cVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  EnumVal *ev;
  EnumVal *ev_00;
  long *plVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  char *__s;
  string num_fields;
  string deprecation_warning;
  string local_ef8;
  key_type local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  IdlNamer *local_e98;
  string local_e90;
  long *local_e70 [2];
  long local_e60 [2];
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  paVar2 = &local_ed8.field_2;
  if ((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations == true) {
    local_ed8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"private","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(enum_def->super_Definition).attributes,&local_ed8);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(enum_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      __s = "pub";
    }
    else {
      __s = "pub(crate)";
      if (*(long *)(cVar4._M_node + 2) == 0) {
        __s = "pub";
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed8._M_dataplus._M_p != paVar2) {
      operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __s = "pub";
  }
  local_ed8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ACCESS_TYPE","");
  local_ef8._M_dataplus._M_p = (pointer)&local_ef8.field_2;
  sVar5 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef8,__s,__s + sVar5);
  this_00 = &this->code_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_ed8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  local_ed8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ENUM_TY","");
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_ef8,pIVar1,enum_def);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_ed8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  local_ed8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"BASE_TYPE","");
  GetEnumTypeForDecl_abi_cxx11_(&local_ef8,this,&enum_def->underlying_type);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_ed8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  local_ed8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ENUM_NAMESPACE","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_ef8,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.namespaces);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_ed8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  local_ed8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ENUM_CONSTANT","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_ef8,pIVar1,enum_def,(ulong)(this->namer_).super_Namer.config_.constants);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_ed8);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  local_e98 = pIVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != paVar2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  ev = EnumDef::MinValue(enum_def);
  ev_00 = EnumDef::MaxValue(enum_def);
  if ((ev != (EnumVal *)0x0) && (ev_00 != (EnumVal *)0x0)) {
    local_ed8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ENUM_MIN_BASE_VALUE","");
    EnumDef::ToString_abi_cxx11_(&local_ef8,enum_def,ev);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_ed8);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
      operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed8._M_dataplus._M_p != paVar2) {
      operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
    }
    local_ed8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"ENUM_MAX_BASE_VALUE","");
    EnumDef::ToString_abi_cxx11_(&local_ef8,enum_def,ev_00);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this_00->value_map_,&local_ed8);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
      operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed8._M_dataplus._M_p != paVar2) {
      operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"#[allow(non_upper_case_globals)]","");
      CodeWriter::operator+=(this_00,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"mod bitflags_{{ENUM_NAMESPACE}} {","");
      CodeWriter::operator+=(this_00,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,"  flatbuffers::bitflags::bitflags! {","");
      CodeWriter::operator+=(this_00,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      GenComment(this,&(enum_def->super_Definition).doc_comment,"    ");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,"    #[derive(Default)]","");
      CodeWriter::operator+=(this_00,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {","");
      CodeWriter::operator+=(this_00,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:734:35)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:734:35)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"    }","");
      CodeWriter::operator+=(this_00,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"  }","");
      CodeWriter::operator+=(this_00,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"}","");
      CodeWriter::operator+=(this_00,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,"pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};","");
      CodeWriter::operator+=(this_00,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"");
      CodeWriter::operator+=(this_00,&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      local_ed8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"INTO_BASE","");
      local_ef8._M_dataplus._M_p = (pointer)&local_ef8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef8,"self.bits()","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_ed8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
    }
    else {
      local_ed8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ed8,
                 "#[deprecated(since = \"2.0.0\", note = \"Use associated constants instead. This will no longer be generated in 2021.\")]"
                 ,"");
      local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a30,local_ed8._M_dataplus._M_p,
                 local_ed8._M_dataplus._M_p + local_ed8._M_string_length);
      CodeWriter::operator+=(this_00,&local_a30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
        operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
      }
      local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a50,
                 "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};",""
                );
      CodeWriter::operator+=(this_00,&local_a50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
        operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
      }
      local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a70,local_ed8._M_dataplus._M_p,
                 local_ed8._M_dataplus._M_p + local_ed8._M_string_length);
      CodeWriter::operator+=(this_00,&local_a70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
        operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
      }
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a90,
                 "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};",""
                );
      CodeWriter::operator+=(this_00,&local_a90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      NumToString<unsigned_long>
                (&local_ef8,
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(enum_def->vals).vec.
                       super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ab0,local_ed8._M_dataplus._M_p,
                 local_ed8._M_dataplus._M_p + local_ed8._M_string_length);
      CodeWriter::operator+=(this_00,&local_ab0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
        operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
      }
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad0,"#[allow(non_camel_case_types)]","");
      CodeWriter::operator+=(this_00,&local_ad0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_eb8,"pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; ",&local_ef8
                    );
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_eb8);
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_e90.field_2._M_allocated_capacity = *psVar8;
        local_e90.field_2._8_8_ = plVar7[3];
        local_e90._M_dataplus._M_p = (pointer)&local_e90.field_2;
      }
      else {
        local_e90.field_2._M_allocated_capacity = *psVar8;
        local_e90._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e90._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      CodeWriter::operator+=(this_00,&local_e90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e90._M_dataplus._M_p != &local_e90.field_2) {
        operator_delete(local_e90._M_dataplus._M_p,local_e90.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_eb8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._M_dataplus._M_p != paVar9) {
        operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
      }
      local_58 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:764:35)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:764:35)>
                 ::_M_manager;
      local_70._M_unused._M_object = this;
      local_70._8_8_ = enum_def;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"];","");
      CodeWriter::operator+=(this_00,&local_af0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
      }
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"");
      CodeWriter::operator+=(this_00,&local_b10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
      }
      GenComment(this,&(enum_def->super_Definition).doc_comment,"");
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b30,
                 "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, Default)]","");
      CodeWriter::operator+=(this_00,&local_b30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b50,"#[repr(transparent)]","");
      CodeWriter::operator+=(this_00,&local_b50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
      }
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b70,"{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});","");
      CodeWriter::operator+=(this_00,&local_b70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,local_b70.field_2._M_allocated_capacity + 1);
      }
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b90,"#[allow(non_upper_case_globals)]","");
      CodeWriter::operator+=(this_00,&local_b90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"impl {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_bb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      local_90._8_8_ = 0;
      local_78 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:781:35)>
                 ::_M_invoke;
      local_80 = std::
                 _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:781:35)>
                 ::_M_manager;
      local_90._M_unused._M_object = this;
      ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_90);
      if (local_80 != (code *)0x0) {
        (*local_80)(&local_90,&local_90,__destroy_functor);
      }
      local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"");
      CodeWriter::operator+=(this_00,&local_bd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
        operator_delete(local_bd0._M_dataplus._M_p,local_bd0.field_2._M_allocated_capacity + 1);
      }
      local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_bf0,
                 "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};","");
      CodeWriter::operator+=(this_00,&local_bf0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
        operator_delete(local_bf0._M_dataplus._M_p,local_bf0.field_2._M_allocated_capacity + 1);
      }
      local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c10,
                 "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};","");
      CodeWriter::operator+=(this_00,&local_c10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
        operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
      }
      local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c30,"  pub const ENUM_VALUES: &\'static [Self] = &[","");
      CodeWriter::operator+=(this_00,&local_c30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
        operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
      }
      local_b0._8_8_ = 0;
      local_98 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:790:34)>
                 ::_M_invoke;
      local_a0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:790:34)>
                 ::_M_manager;
      local_b0._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_b0);
      if (local_a0 != (code *)0x0) {
        (*local_a0)(&local_b0,&local_b0,__destroy_functor);
      }
      local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"  ];","");
      CodeWriter::operator+=(this_00,&local_c50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
        operator_delete(local_c50._M_dataplus._M_p,local_c50.field_2._M_allocated_capacity + 1);
      }
      local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c70,"  /// Returns the variant\'s name or \"\" if unknown.","");
      CodeWriter::operator+=(this_00,&local_c70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
        operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
      }
      local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c90,"  pub fn variant_name(self) -> Option<&\'static str> {","");
      CodeWriter::operator+=(this_00,&local_c90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
        operator_delete(local_c90._M_dataplus._M_p,local_c90.field_2._M_allocated_capacity + 1);
      }
      local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"    match self {","");
      CodeWriter::operator+=(this_00,&local_cb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
        operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
      }
      local_d0._8_8_ = 0;
      local_b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:795:34)>
                 ::_M_invoke;
      local_c0 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp:795:34)>
                 ::_M_manager;
      local_d0._M_unused._M_object = this;
      ForAllEnumValues(this,enum_def,(function<void_()> *)&local_d0);
      if (local_c0 != (code *)0x0) {
        (*local_c0)(&local_d0,&local_d0,__destroy_functor);
      }
      local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd0,"      _ => None,","");
      CodeWriter::operator+=(this_00,&local_cd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
        operator_delete(local_cd0._M_dataplus._M_p,local_cd0.field_2._M_allocated_capacity + 1);
      }
      local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"    }","");
      CodeWriter::operator+=(this_00,&local_cf0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
        operator_delete(local_cf0._M_dataplus._M_p,local_cf0.field_2._M_allocated_capacity + 1);
      }
      local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"  }","");
      CodeWriter::operator+=(this_00,&local_d10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
        operator_delete(local_d10._M_dataplus._M_p,local_d10.field_2._M_allocated_capacity + 1);
      }
      local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"}","");
      CodeWriter::operator+=(this_00,&local_d30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
        operator_delete(local_d30._M_dataplus._M_p,local_d30.field_2._M_allocated_capacity + 1);
      }
      local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d50,"impl core::fmt::Debug for {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_d50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
        operator_delete(local_d50._M_dataplus._M_p,local_d50.field_2._M_allocated_capacity + 1);
      }
      local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d70,
                 "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {","");
      CodeWriter::operator+=(this_00,&local_d70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
        operator_delete(local_d70._M_dataplus._M_p,local_d70.field_2._M_allocated_capacity + 1);
      }
      local_d90._M_dataplus._M_p = (pointer)&local_d90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d90,"    if let Some(name) = self.variant_name() {","");
      CodeWriter::operator+=(this_00,&local_d90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
        operator_delete(local_d90._M_dataplus._M_p,local_d90.field_2._M_allocated_capacity + 1);
      }
      local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db0,"      f.write_str(name)","");
      CodeWriter::operator+=(this_00,&local_db0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
        operator_delete(local_db0._M_dataplus._M_p,local_db0.field_2._M_allocated_capacity + 1);
      }
      local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"    } else {","");
      CodeWriter::operator+=(this_00,&local_dd0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
        operator_delete(local_dd0._M_dataplus._M_p,local_dd0.field_2._M_allocated_capacity + 1);
      }
      local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_df0,"      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))",
                 "");
      CodeWriter::operator+=(this_00,&local_df0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
        operator_delete(local_df0._M_dataplus._M_p,local_df0.field_2._M_allocated_capacity + 1);
      }
      local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"    }","");
      CodeWriter::operator+=(this_00,&local_e10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
        operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
      }
      local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"  }","");
      CodeWriter::operator+=(this_00,&local_e30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
        operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1);
      }
      local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e50,"}","");
      CodeWriter::operator+=(this_00,&local_e50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e50._M_dataplus._M_p != &local_e50.field_2) {
        operator_delete(local_e50._M_dataplus._M_p,local_e50.field_2._M_allocated_capacity + 1);
      }
      local_eb8._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb8,"INTO_BASE","");
      local_e70[0] = local_e60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e70,"self.0","");
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_eb8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if (local_e70[0] != local_e60) {
        operator_delete(local_e70[0],local_e60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._M_dataplus._M_p != paVar9) {
        operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
      operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ed8._M_dataplus._M_p != paVar2) {
      operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
    }
    if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"impl Serialize for {{ENUM_TY}} {","");
      CodeWriter::operator+=(this_00,&local_2f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,
                 "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>","");
      CodeWriter::operator+=(this_00,&local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"  where","");
      CodeWriter::operator+=(this_00,&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
      }
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"    S: Serializer,","");
      CodeWriter::operator+=(this_00,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"  {","");
      CodeWriter::operator+=(this_00,&local_370);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
      if (bVar3) {
        paVar9 = &local_f0.field_2;
        local_f0._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"    serializer.serialize_u32(self.bits() as u32)","");
        CodeWriter::operator+=(this_00,&local_f0);
        _Var10._M_p = local_f0._M_dataplus._M_p;
      }
      else {
        paVar9 = &local_110.field_2;
        local_110._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 as u32, self.variant_name().unwrap())"
                   ,"");
        CodeWriter::operator+=(this_00,&local_110);
        _Var10._M_p = local_110._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar9) {
        operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
      }
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"  }","");
      CodeWriter::operator+=(this_00,&local_390);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"}","");
      CodeWriter::operator+=(this_00,&local_3b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
      CodeWriter::operator+=(this_00,&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f0,"impl<\'a> flatbuffers::Follow<\'a> for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_3f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"  type Inner = Self;","");
    CodeWriter::operator+=(this_00,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_450,
               "  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {","");
    CodeWriter::operator+=(this_00,&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_470,
               "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);","");
    CodeWriter::operator+=(this_00,&local_470);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"    // Safety:","");
      CodeWriter::operator+=(this_00,&local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4b0,
                 "    // This is safe because we know bitflags is implemented with a repr transparent uint of the correct size."
                 ,"");
      CodeWriter::operator+=(this_00,&local_4b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4d0,
                 "    // from_bits_unchecked will be replaced by an equivalent but safe from_bits_retain in bitflags 2.0"
                 ,"");
      CodeWriter::operator+=(this_00,&local_4d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f0,"    // https://github.com/bitflags/bitflags/issues/262","");
      CodeWriter::operator+=(this_00,&local_4f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_130.field_2;
      local_130._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"    Self::from_bits_unchecked(b)","");
      CodeWriter::operator+=(this_00,&local_130);
      _Var10._M_p = local_130._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"    Self(b)","");
      CodeWriter::operator+=(this_00,&local_150);
      _Var10._M_p = local_150._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar9) {
      operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
    }
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"  }","");
    CodeWriter::operator+=(this_00,&local_510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"}","");
    CodeWriter::operator+=(this_00,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"");
    CodeWriter::operator+=(this_00,&local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_570,"impl flatbuffers::Push for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
    }
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_590,"    type Output = {{ENUM_TY}};","");
    CodeWriter::operator+=(this_00,&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"    #[inline]","");
    CodeWriter::operator+=(this_00,&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5d0,
               "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {","");
    CodeWriter::operator+=(this_00,&local_5d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
    }
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f0,
               "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, {{INTO_BASE}});","");
    CodeWriter::operator+=(this_00,&local_5f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"    }","");
    CodeWriter::operator+=(this_00,&local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
    }
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"}","");
    CodeWriter::operator+=(this_00,&local_630);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
    }
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"");
    CodeWriter::operator+=(this_00,&local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_670,"impl flatbuffers::EndianScalar for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_670);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
    }
    local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_690,"  type Scalar = {{BASE_TYPE}};","");
    CodeWriter::operator+=(this_00,&local_690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._M_dataplus._M_p != &local_690.field_2) {
      operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
    }
    local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_6b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
      operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
    }
    local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6d0,"  fn to_little_endian(self) -> {{BASE_TYPE}} {","");
    CodeWriter::operator+=(this_00,&local_6d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
    }
    local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6f0,"    {{INTO_BASE}}.to_le()","");
    CodeWriter::operator+=(this_00,&local_6f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
      operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
    }
    local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"  }","");
    CodeWriter::operator+=(this_00,&local_710);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._M_dataplus._M_p != &local_710.field_2) {
      operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
    }
    local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_730);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._M_dataplus._M_p != &local_730.field_2) {
      operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
    }
    local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_750,"  #[allow(clippy::wrong_self_convention)]","");
    CodeWriter::operator+=(this_00,&local_750);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._M_dataplus._M_p != &local_750.field_2) {
      operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
    }
    local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_770,"  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {","");
    CodeWriter::operator+=(this_00,&local_770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._M_dataplus._M_p != &local_770.field_2) {
      operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
    }
    local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_790,"    let b = {{BASE_TYPE}}::from_le(v);","");
    CodeWriter::operator+=(this_00,&local_790);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._M_dataplus._M_p != &local_790.field_2) {
      operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_26::IsBitFlagsEnum(enum_def);
    if (bVar3) {
      local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"    // Safety:","");
      CodeWriter::operator+=(this_00,&local_7b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
      }
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7d0,
                 "    // This is safe because we know bitflags is implemented with a repr transparent uint of the correct size."
                 ,"");
      CodeWriter::operator+=(this_00,&local_7d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
        operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
      }
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7f0,
                 "    // from_bits_unchecked will be replaced by an equivalent but safe from_bits_retain in bitflags 2.0"
                 ,"");
      CodeWriter::operator+=(this_00,&local_7f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_810,"    // https://github.com/bitflags/bitflags/issues/262","");
      CodeWriter::operator+=(this_00,&local_810);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_810._M_dataplus._M_p != &local_810.field_2) {
        operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_170.field_2;
      local_170._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"    unsafe { Self::from_bits_unchecked(b) }","");
      CodeWriter::operator+=(this_00,&local_170);
      _Var10._M_p = local_170._M_dataplus._M_p;
    }
    else {
      paVar9 = &local_190.field_2;
      local_190._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"    Self(b)","");
      CodeWriter::operator+=(this_00,&local_190);
      _Var10._M_p = local_190._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar9) {
      operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
    }
    local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"  }","");
    CodeWriter::operator+=(this_00,&local_830);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_dataplus._M_p != &local_830.field_2) {
      operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
    }
    local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"}","");
    CodeWriter::operator+=(this_00,&local_850);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_dataplus._M_p != &local_850.field_2) {
      operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
    }
    local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"");
    CodeWriter::operator+=(this_00,&local_870);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_870._M_dataplus._M_p != &local_870.field_2) {
      operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
    }
    local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_890,"impl<\'a> flatbuffers::Verifiable for {{ENUM_TY}} {","");
    CodeWriter::operator+=(this_00,&local_890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_dataplus._M_p != &local_890.field_2) {
      operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
    }
    local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"  #[inline]","");
    CodeWriter::operator+=(this_00,&local_8b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
      operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
    }
    local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"  fn run_verifier(","");
    CodeWriter::operator+=(this_00,&local_8d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
      operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
    }
    local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_8f0,"    v: &mut flatbuffers::Verifier, pos: usize","");
    CodeWriter::operator+=(this_00,&local_8f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
      operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
    }
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_910,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {","");
    CodeWriter::operator+=(this_00,&local_910);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_910._M_dataplus._M_p != &local_910.field_2) {
      operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
    }
    local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_930,"    use self::flatbuffers::Verifiable;","");
    CodeWriter::operator+=(this_00,&local_930);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_930._M_dataplus._M_p != &local_930.field_2) {
      operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
    }
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_950,"    {{BASE_TYPE}}::run_verifier(v, pos)","");
    CodeWriter::operator+=(this_00,&local_950);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_950._M_dataplus._M_p != &local_950.field_2) {
      operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
    }
    local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"  }","");
    CodeWriter::operator+=(this_00,&local_970);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970._M_dataplus._M_p != &local_970.field_2) {
      operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
    }
    local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"}","");
    CodeWriter::operator+=(this_00,&local_990);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_990._M_dataplus._M_p != &local_990.field_2) {
      operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
    }
    local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"");
    CodeWriter::operator+=(this_00,&local_9b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
      operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
    }
    local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9d0,"impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}","")
    ;
    CodeWriter::operator+=(this_00,&local_9d0);
    pIVar1 = local_e98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
      operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
    }
    if (enum_def->is_union == true) {
      local_ed8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed8,"UNION_TYPE","");
      (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_ef8,pIVar1,enum_def);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->value_map_,&local_ed8);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
        operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ed8._M_dataplus._M_p != paVar2) {
        operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
      }
      local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_9f0,"{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}","")
      ;
      CodeWriter::operator+=(this_00,&local_9f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
        operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
      }
      local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"");
      CodeWriter::operator+=(this_00,&local_a10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
        operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
      }
      if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
        GenUnionObject(this,enum_def);
      }
    }
    return;
  }
  __assert_fail("minv && maxv",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x2cf,"void flatbuffers::rust::RustGenerator::GenEnum(const EnumDef &)");
}

Assistant:

void GenEnum(const EnumDef &enum_def) {
    const bool is_private = parser_.opts.no_leak_private_annotations &&
                            (enum_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    code_.SetValue("ENUM_TY", namer_.Type(enum_def));
    code_.SetValue("BASE_TYPE", GetEnumTypeForDecl(enum_def.underlying_type));
    code_.SetValue("ENUM_NAMESPACE", namer_.Namespace(enum_def.name));
    code_.SetValue("ENUM_CONSTANT", namer_.Constant(enum_def.name));
    const EnumVal *minv = enum_def.MinValue();
    const EnumVal *maxv = enum_def.MaxValue();
    FLATBUFFERS_ASSERT(minv && maxv);
    code_.SetValue("ENUM_MIN_BASE_VALUE", enum_def.ToString(*minv));
    code_.SetValue("ENUM_MAX_BASE_VALUE", enum_def.ToString(*maxv));

    if (IsBitFlagsEnum(enum_def)) {
      // Defer to the convenient and canonical bitflags crate. We declare it in
      // a module to #allow camel case constants in a smaller scope. This
      // matches Flatbuffers c-modeled enums where variants are associated
      // constants but in camel case.
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "mod bitflags_{{ENUM_NAMESPACE}} {";
      code_ += "  flatbuffers::bitflags::bitflags! {";
      GenComment(enum_def.doc_comment, "    ");
      code_ += "    #[derive(Default)]";
      code_ += "    {{ACCESS_TYPE}} struct {{ENUM_TY}}: {{BASE_TYPE}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment, "    ");
        code_ += "    const {{VARIANT}} = {{VALUE}};";
      });
      code_ += "    }";
      code_ += "  }";
      code_ += "}";
      code_ += "pub use self::bitflags_{{ENUM_NAMESPACE}}::{{ENUM_TY}};";
      code_ += "";

      code_.SetValue("INTO_BASE", "self.bits()");
    } else {
      // Normal, c-modelled enums.
      // Deprecated associated constants;
      const std::string deprecation_warning =
          "#[deprecated(since = \"2.0.0\", note = \"Use associated constants"
          " instead. This will no longer be generated in 2021.\")]";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MIN_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MIN_BASE_VALUE}};";
      code_ += deprecation_warning;
      code_ +=
          "pub const ENUM_MAX_{{ENUM_CONSTANT}}: {{BASE_TYPE}}"
          " = {{ENUM_MAX_BASE_VALUE}};";
      auto num_fields = NumToString(enum_def.size());
      code_ += deprecation_warning;
      code_ += "#[allow(non_camel_case_types)]";
      code_ += "pub const ENUM_VALUES_{{ENUM_CONSTANT}}: [{{ENUM_TY}}; " +
               num_fields + "] = [";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        code_ += namer_.EnumVariant(enum_def, ev) + ",";
      });
      code_ += "];";
      code_ += "";

      GenComment(enum_def.doc_comment);
      // Derive Default to be 0. flatc enforces this when the enum
      // is put into a struct, though this isn't documented behavior, it is
      // needed to derive defaults in struct objects.
      code_ +=
          "#[derive(Clone, Copy, PartialEq, Eq, PartialOrd, Ord, Hash, "
          "Default)]";
      code_ += "#[repr(transparent)]";
      code_ += "{{ACCESS_TYPE}} struct {{ENUM_TY}}(pub {{BASE_TYPE}});";
      code_ += "#[allow(non_upper_case_globals)]";
      code_ += "impl {{ENUM_TY}} {";
      ForAllEnumValues1(enum_def, [&](const EnumVal &ev) {
        this->GenComment(ev.doc_comment);
        code_ += "pub const {{VARIANT}}: Self = Self({{VALUE}});";
      });
      code_ += "";
      // Generate Associated constants
      code_ += "  pub const ENUM_MIN: {{BASE_TYPE}} = {{ENUM_MIN_BASE_VALUE}};";
      code_ += "  pub const ENUM_MAX: {{BASE_TYPE}} = {{ENUM_MAX_BASE_VALUE}};";
      code_ += "  pub const ENUM_VALUES: &'static [Self] = &[";
      ForAllEnumValues(enum_def, [&]() { code_ += "  Self::{{VARIANT}},"; });
      code_ += "  ];";
      code_ += "  /// Returns the variant's name or \"\" if unknown.";
      code_ += "  pub fn variant_name(self) -> Option<&'static str> {";
      code_ += "    match self {";
      ForAllEnumValues(enum_def, [&]() {
        code_ += "    Self::{{VARIANT}} => Some(\"{{VARIANT}}\"),";
      });
      code_ += "      _ => None,";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      // Generate Debug. Unknown variants are printed like "<UNKNOWN 42>".
      code_ += "impl core::fmt::Debug for {{ENUM_TY}} {";
      code_ +=
          "  fn fmt(&self, f: &mut core::fmt::Formatter) ->"
          " core::fmt::Result {";
      code_ += "    if let Some(name) = self.variant_name() {";
      code_ += "      f.write_str(name)";
      code_ += "    } else {";
      code_ += "      f.write_fmt(format_args!(\"<UNKNOWN {:?}>\", self.0))";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_.SetValue("INTO_BASE", "self.0");
    }

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      code_ += "impl Serialize for {{ENUM_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (IsBitFlagsEnum(enum_def)) {
        code_ += "    serializer.serialize_u32(self.bits() as u32)";
      } else {
        code_ +=
            "    serializer.serialize_unit_variant(\"{{ENUM_TY}}\", self.0 "
            "as "
            "u32, self.variant_name().unwrap())";
      }
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate Follow and Push so we can serialize and stuff.
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{ENUM_TY}} {";
    code_ += "  type Inner = Self;";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ +=
        "    let b = flatbuffers::read_scalar_at::<{{BASE_TYPE}}>(buf, loc);";
    if (IsBitFlagsEnum(enum_def)) {
      // Safety:
      // This is safe because we know bitflags is implemented with a repr
      // transparent uint of the correct size. from_bits_unchecked will be
      // replaced by an equivalent but safe from_bits_retain in bitflags 2.0
      // https://github.com/bitflags/bitflags/issues/262
      code_ += "    // Safety:";
      code_ +=
          "    // This is safe because we know bitflags is implemented with a "
          "repr transparent uint of the correct size.";
      code_ +=
          "    // from_bits_unchecked will be replaced by an equivalent but "
          "safe from_bits_retain in bitflags 2.0";
      code_ += "    // https://github.com/bitflags/bitflags/issues/262";
      code_ += "    Self::from_bits_unchecked(b)";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::Push for {{ENUM_TY}} {";
    code_ += "    type Output = {{ENUM_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        flatbuffers::emplace_scalar::<{{BASE_TYPE}}>(dst, "
        "{{INTO_BASE}});";
    code_ += "    }";
    code_ += "}";
    code_ += "";
    code_ += "impl flatbuffers::EndianScalar for {{ENUM_TY}} {";
    code_ += "  type Scalar = {{BASE_TYPE}};";
    code_ += "  #[inline]";
    code_ += "  fn to_little_endian(self) -> {{BASE_TYPE}} {";
    code_ += "    {{INTO_BASE}}.to_le()";
    code_ += "  }";
    code_ += "  #[inline]";
    code_ += "  #[allow(clippy::wrong_self_convention)]";
    code_ += "  fn from_little_endian(v: {{BASE_TYPE}}) -> Self {";
    code_ += "    let b = {{BASE_TYPE}}::from_le(v);";
    if (IsBitFlagsEnum(enum_def)) {
      // Safety:
      // This is safe because we know bitflags is implemented with a repr
      // transparent uint of the correct size. from_bits_unchecked will be
      // replaced by an equivalent but safe from_bits_retain in bitflags 2.0
      // https://github.com/bitflags/bitflags/issues/262
      code_ += "    // Safety:";
      code_ +=
          "    // This is safe because we know bitflags is implemented with a "
          "repr transparent uint of the correct size.";
      code_ +=
          "    // from_bits_unchecked will be replaced by an equivalent but "
          "safe from_bits_retain in bitflags 2.0";
      code_ += "    // https://github.com/bitflags/bitflags/issues/262";
      code_ += "    unsafe { Self::from_bits_unchecked(b) }";
    } else {
      code_ += "    Self(b)";
    }
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate verifier - deferring to the base type.
    code_ += "impl<'a> flatbuffers::Verifiable for {{ENUM_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    {{BASE_TYPE}}::run_verifier(v, pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";
    // Enums are basically integers.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{ENUM_TY}} {}";

    if (enum_def.is_union) {
      // Generate typesafe offset(s) for unions
      code_.SetValue("UNION_TYPE", namer_.Type(enum_def));
      code_ += "{{ACCESS_TYPE}} struct {{UNION_TYPE}}UnionTableOffset {}";
      code_ += "";
      if (parser_.opts.generate_object_based_api) { GenUnionObject(enum_def); }
    }
  }